

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_ssm_scan(ggml_context *ctx,ggml_tensor *s,ggml_tensor *x,ggml_tensor *dt,ggml_tensor *A,
             ggml_tensor *B,ggml_tensor *C)

{
  size_t sVar1;
  _Bool _Var2;
  size_t sVar3;
  int64_t iVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_context *in_RDI;
  ggml_tensor *in_R8;
  ggml_tensor *in_R9;
  ggml_tensor *in_stack_00000008;
  ggml_tensor *result;
  int64_t n_seqs;
  int64_t n_seq_tokens;
  int64_t d_inner;
  int64_t d_state;
  ggml_type type;
  
  _Var2 = ggml_is_contiguous((ggml_tensor *)0x152154);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11d6,"GGML_ASSERT(%s) failed","ggml_is_contiguous(s)");
  }
  _Var2 = ggml_is_contiguous((ggml_tensor *)0x152183);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11d7,"GGML_ASSERT(%s) failed","ggml_is_contiguous(x)");
  }
  _Var2 = ggml_is_contiguous((ggml_tensor *)0x1521b2);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11d8,"GGML_ASSERT(%s) failed","ggml_is_contiguous(dt)");
  }
  _Var2 = ggml_is_contiguous((ggml_tensor *)0x1521e1);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11d9,"GGML_ASSERT(%s) failed","ggml_is_contiguous(A)");
  }
  _Var2 = ggml_is_matrix(in_R8);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11da,"GGML_ASSERT(%s) failed","ggml_is_matrix(A)");
  }
  _Var2 = ggml_is_3d(in_R9);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11db,"GGML_ASSERT(%s) failed","ggml_is_3d(B)");
  }
  _Var2 = ggml_is_3d(in_RSI);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11dc,"GGML_ASSERT(%s) failed","ggml_is_3d(s)");
  }
  sVar1 = in_R9->nb[0];
  sVar3 = ggml_type_size(in_R9->type);
  if (sVar1 != sVar3) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11dd,"GGML_ASSERT(%s) failed","B->nb[0] == ggml_type_size(B->type)");
  }
  sVar1 = in_stack_00000008->nb[0];
  sVar3 = ggml_type_size(in_stack_00000008->type);
  if (sVar1 != sVar3) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11de,"GGML_ASSERT(%s) failed","C->nb[0] == ggml_type_size(C->type)");
  }
  _Var2 = ggml_are_same_shape(in_RDX,in_RCX);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11df,"GGML_ASSERT(%s) failed","ggml_are_same_shape(x, dt)");
  }
  _Var2 = ggml_are_same_shape(in_R9,in_stack_00000008);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11e0,"GGML_ASSERT(%s) failed","ggml_are_same_shape(B, C)");
  }
  if (in_RSI->ne[2] != in_RDX->ne[2]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11e8,"GGML_ASSERT(%s) failed","s->ne[2] == n_seqs");
  }
  if (in_RDX->ne[0] != in_RSI->ne[1]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11e9,"GGML_ASSERT(%s) failed","x->ne[0] == d_inner");
  }
  if (in_R8->ne[0] != in_RSI->ne[0]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11ea,"GGML_ASSERT(%s) failed","A->ne[0] == d_state");
  }
  if (in_R8->ne[1] != in_RSI->ne[1]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11eb,"GGML_ASSERT(%s) failed","A->ne[1] == d_inner");
  }
  if (in_R9->ne[0] != in_RSI->ne[0]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11ec,"GGML_ASSERT(%s) failed","B->ne[0] == d_state");
  }
  if (in_R9->ne[1] != in_RDX->ne[1]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11ed,"GGML_ASSERT(%s) failed","B->ne[1] == n_seq_tokens");
  }
  if (in_R9->ne[2] != in_RDX->ne[2]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x11ee,"GGML_ASSERT(%s) failed","B->ne[2] == n_seqs");
  }
  iVar4 = ggml_nelements(in_RDX);
  type = (ggml_type)((ulong)iVar4 >> 0x20);
  ggml_nelements(in_RSI);
  pgVar5 = ggml_new_tensor_1d(in_RDI,type,0x152558);
  pgVar5->op = GGML_OP_SSM_SCAN;
  pgVar5->src[0] = in_RSI;
  pgVar5->src[1] = in_RDX;
  pgVar5->src[2] = in_RCX;
  pgVar5->src[3] = in_R8;
  pgVar5->src[4] = in_R9;
  pgVar5->src[5] = in_stack_00000008;
  return pgVar5;
}

Assistant:

struct ggml_tensor * ggml_ssm_scan(
        struct ggml_context * ctx,
        struct ggml_tensor  * s,
        struct ggml_tensor  * x,
        struct ggml_tensor  * dt,
        struct ggml_tensor  * A,
        struct ggml_tensor  * B,
        struct ggml_tensor  * C) {
    GGML_ASSERT(ggml_is_contiguous(s));
    GGML_ASSERT(ggml_is_contiguous(x));
    GGML_ASSERT(ggml_is_contiguous(dt));
    GGML_ASSERT(ggml_is_contiguous(A));
    GGML_ASSERT(ggml_is_matrix(A));
    GGML_ASSERT(ggml_is_3d(B));
    GGML_ASSERT(ggml_is_3d(s));
    GGML_ASSERT(B->nb[0] == ggml_type_size(B->type));
    GGML_ASSERT(C->nb[0] == ggml_type_size(C->type));
    GGML_ASSERT(ggml_are_same_shape(x, dt));
    GGML_ASSERT(ggml_are_same_shape(B, C));

    {
        const int64_t d_state      = s->ne[0];
        const int64_t d_inner      = s->ne[1];
        const int64_t n_seq_tokens = x->ne[1];
        const int64_t n_seqs       = x->ne[2];

        GGML_ASSERT(s->ne[2] == n_seqs);
        GGML_ASSERT(x->ne[0] == d_inner);
        GGML_ASSERT(A->ne[0] == d_state);
        GGML_ASSERT(A->ne[1] == d_inner);
        GGML_ASSERT(B->ne[0] == d_state);
        GGML_ASSERT(B->ne[1] == n_seq_tokens);
        GGML_ASSERT(B->ne[2] == n_seqs);
    }

    // concatenated y + ssm_states
    struct ggml_tensor * result = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, ggml_nelements(x) + ggml_nelements(s));

    result->op   = GGML_OP_SSM_SCAN;
    result->src[0] = s;
    result->src[1] = x;
    result->src[2] = dt;
    result->src[3] = A;
    result->src[4] = B;
    result->src[5] = C;

    return result;
}